

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_(const_std::error_code_&)>::callback<sock1>
          (callback<void_(const_std::error_code_&)> *this,sock1 func)

{
  sock1 f;
  void *pvVar1;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *in_RDI;
  callable_impl<void,_sock1> *this_00;
  callable<void_(const_std::error_code_&)> *p;
  undefined1 *puVar2;
  
  puVar2 = &stack0x00000008;
  pvVar1 = operator_new(0x28);
  p = *(callable<void_(const_std::error_code_&)> **)(puVar2 + 0x10);
  this_00 = *(callable_impl<void,_sock1> **)(puVar2 + 8);
  f.srv = (io_service *)puVar2;
  f._0_8_ = in_RDI;
  f._16_8_ = pvVar1;
  callable_impl<void,_sock1>::callable_impl(this_00,f);
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            (in_RDI,p,SUB81((ulong)this_00 >> 0x38,0));
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}